

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

size_t Fossilize::deduce_imported_size(void *mapped,size_t maximum_size)

{
  long *plVar1;
  ExportedMetadataHeader *header;
  size_t total_size;
  size_t maximum_size_local;
  void *mapped_local;
  
  for (header = (ExportedMetadataHeader *)0x0;
      ((header + 1 <= maximum_size &&
       (plVar1 = (long *)((long)mapped + (long)header),
       (ulong)((long)&((ExportedMetadataHeader *)(header->lists + -1))->magic + plVar1[1]) <=
       maximum_size)) && ((*plVar1 == 0xb10bf05511153 || (*plVar1 == 0xb10b5f05511153))));
      header = (ExportedMetadataHeader *)
               ((long)&((ExportedMetadataHeader *)(header->lists + -1))->magic + plVar1[1])) {
  }
  return (size_t)header;
}

Assistant:

static size_t deduce_imported_size(const void *mapped, size_t maximum_size)
{
	size_t total_size = 0;
	while (total_size + sizeof(ExportedMetadataHeader) <= maximum_size)
	{
		auto *header = reinterpret_cast<const ExportedMetadataHeader *>(static_cast<const uint8_t *>(mapped) + total_size);
		if (header->size + total_size > maximum_size)
			break;
		if (header->magic != ExportedMetadataMagic && header->magic != ExportedMetadataMagicConcurrent)
			break;
		total_size += header->size;
	}

	return total_size;
}